

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

string * __thiscall pbrt::MediumHandle::ToString_abi_cxx11_(MediumHandle *this)

{
  void *pvVar1;
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  anon_class_1_0_00000001 ts;
  allocator<char> local_11;
  allocator<char> *__a;
  string *__s;
  
  __a = in_RSI;
  __s = in_RDI;
  pvVar1 = TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           ::ptr((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                  *)in_RSI);
  if (pvVar1 == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    TaggedPointer<pbrt::HomogeneousMedium,pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,pbrt::GeneralMedium<pbrt::CloudMediumProvider>,pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>>
    ::DispatchCPU<pbrt::MediumHandle::ToString[abi:cxx11]()const::__0>
              ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string MediumHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}